

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O2

void test_AString_replaceRangeCString_success_smallerReplaceLength_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  AString string;
  
  private_ACUtilsTest_AString_constructTestString(&string,"012xxx45",8);
  private_ACUtilsTest_AString_reallocFail = 0;
  bVar1 = AString_replaceRangeCString(&string,3,3,"3",1);
  if (bVar1 == false) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x5f3,
                      "Assertion \'AString_replaceRangeCString(&string, 3, 3, \"3\", 1)\' failed",0,
                      0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x5f3);
  if (string.capacity == 8) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x5f4);
    if (string.buffer == (char *)0x0) {
      string.size = 0;
      pcVar6 = (char *)0x0;
      expr = "Assertion \'_ck_x != NULL\' failed";
      pcVar3 = "Assertion \'%s\' failed: %s == %#x";
      pcVar4 = "(void*) (string).buffer != NULL";
      pcVar5 = "(void*) (string).buffer";
    }
    else {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x5f4);
      pcVar6 = string.buffer;
      if (string.buffer == (char *)0x0) {
        string.size = 0x16819b;
        pcVar6 = "(null)";
      }
      else {
        iVar2 = strcmp("012345",string.buffer);
        if (iVar2 == 0) {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x5f4);
          if (string.size == 6) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x5f4);
            if (private_ACUtilsTest_AString_reallocCount == 0) {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x5f5);
              (*string.deallocator)(string.buffer);
              return;
            }
            pcVar6 = "(0)";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar4 = "private_ACUtilsTest_AString_reallocCount == (0)";
            pcVar5 = "private_ACUtilsTest_AString_reallocCount";
            iVar2 = 0x5f5;
            string.size = private_ACUtilsTest_AString_reallocCount;
            goto LAB_00137484;
          }
          pcVar6 = "strlen(\"012345\")";
          expr = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
          pcVar4 = "(string).size == strlen(\"012345\")";
          pcVar5 = "(string).size";
          goto LAB_0013747f;
        }
        string.size = 0x15c553;
      }
      expr = 
      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
      ;
      pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
      pcVar4 = "(string).buffer == (\"012345\")";
      pcVar5 = "(string).buffer";
    }
  }
  else {
    pcVar6 = "(8)";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar4 = "(string).capacity == (8)";
    pcVar5 = "(string).capacity";
    string.size = string.capacity;
  }
LAB_0013747f:
  iVar2 = 0x5f4;
LAB_00137484:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar2,expr,pcVar3,pcVar4,pcVar5,string.size,pcVar6);
}

Assistant:

END_TEST
START_TEST(test_AString_replaceRangeCString_success_smallerReplaceLength)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("012xxx45", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT(AString_replaceRangeCString(&string, 3, 3, "3", 1));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "012345", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(string);
}